

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

tc_uECC_word_t
regularize_k(tc_uECC_word_t *k,tc_uECC_word_t *k0,tc_uECC_word_t *k1,tc_uECC_Curve curve)

{
  short bit;
  char num_words;
  tc_uECC_word_t tVar1;
  bool local_32;
  bool local_31;
  tc_uECC_word_t carry;
  bitcount_t num_n_bits;
  wordcount_t num_n_words;
  tc_uECC_Curve curve_local;
  tc_uECC_word_t *k1_local;
  tc_uECC_word_t *k0_local;
  tc_uECC_word_t *k_local;
  
  num_words = (char)((curve->num_n_bits + 0x1f) / 0x20);
  bit = curve->num_n_bits;
  tVar1 = tc_uECC_vli_add(k0,k,curve->n,num_words);
  local_31 = true;
  if (tVar1 == 0) {
    local_32 = false;
    if ((int)bit < (short)num_words * 0x20) {
      tVar1 = tc_uECC_vli_testBit(k0,bit);
      local_32 = tVar1 != 0;
    }
    local_31 = local_32;
  }
  tc_uECC_vli_add(k1,k0,curve->n,num_words);
  return (uint)local_31;
}

Assistant:

tc_uECC_word_t regularize_k(const tc_uECC_word_t * const k, tc_uECC_word_t *k0,
			 tc_uECC_word_t *k1, tc_uECC_Curve curve)
{

	wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

	bitcount_t num_n_bits = curve->num_n_bits;

	tc_uECC_word_t carry = tc_uECC_vli_add(k0, k, curve->n, num_n_words) ||
			     (num_n_bits < ((bitcount_t)num_n_words * tc_uECC_WORD_SIZE * 8) &&
			     tc_uECC_vli_testBit(k0, num_n_bits));

	tc_uECC_vli_add(k1, k0, curve->n, num_n_words);

	return carry;
}